

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

statement_base * __thiscall
cs::method_return_no_value::translate
          (method_return_no_value *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Elt_pointer pdVar3;
  token_base *ptVar4;
  int iVar5;
  token_value *ptVar6;
  statement_base *psVar7;
  undefined4 extraout_var;
  size_t size;
  _Elt_pointer pptVar8;
  tree_type<cs::token_base_*> tree;
  any local_30;
  tree_node *local_28;
  token_value *local_20;
  
  local_28 = (tree_node *)0x0;
  ptVar6 = (token_value *)token_base::operator_new((token_base *)0x18,(size_t)context);
  cs_impl::any::any<cs::pointer>(&local_30,(pointer *)&null_pointer);
  (ptVar6->super_token_base).line_num = 1;
  (ptVar6->super_token_base)._vptr_token_base = (_func_int **)&PTR__token_value_0024f0a0;
  (ptVar6->mVal).mDat = local_30.mDat;
  local_30.mDat = (proxy *)0x0;
  size = 0;
  local_20 = ptVar6;
  tree_type<cs::token_base*>::emplace_root_left<cs::token_value*>
            ((tree_type<cs::token_base*> *)&local_28,(iterator)0x0,&local_20);
  cs_impl::any::recycle(&local_30);
  psVar7 = (statement_base *)statement_base::operator_new((statement_base *)0x28,size);
  iVar5 = tree_type<cs::token_base_*>::copy((EVP_PKEY_CTX *)local_28,(EVP_PKEY_CTX *)0x0);
  peVar1 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  pdVar3 = (raw->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pptVar8 = (pdVar3->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  if (pptVar8 ==
      (pdVar3->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    pptVar8 = (pdVar3->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ptVar4 = pptVar8[-1];
  (psVar7->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1
  ;
  (psVar7->context).super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  psVar7->line_num = ptVar4->line_num;
  psVar7->_vptr_statement_base = (_func_int **)&PTR__statement_return_00254990;
  psVar7[1]._vptr_statement_base = (_func_int **)CONCAT44(extraout_var,iVar5);
  tree_type<cs::token_base_*>::destroy((tree_node *)0x0);
  tree_type<cs::token_base_*>::destroy(local_28);
  return psVar7;
}

Assistant:

statement_base *
	method_return_no_value::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> tree;
		tree.emplace_root_left(tree.root(), new token_value(null_pointer));
		return new statement_return(tree, context, raw.front().back());
	}